

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O0

void check_sysout(char *sysout_file_name,int verbose)

{
  int __fd;
  __off_t _Var1;
  ssize_t sVar2;
  char local_1c8 [8];
  char errmsg [255];
  IFPAGE ifpage;
  int sysout;
  int verbose_local;
  char *sysout_file_name_local;
  
  __fd = open(sysout_file_name,0);
  if (__fd == -1) {
    sprintf(local_1c8,"sysout_loader: can\'t open sysout file: %s",sysout_file_name);
    perror(local_1c8);
    exit(-1);
  }
  _Var1 = lseek(__fd,0x200,0);
  if (_Var1 == -1) {
    perror("sysout_loader: can\'t seek to IFPAGE");
    exit(-1);
  }
  sVar2 = read(__fd,errmsg + 0xf8,0xb0);
  if (sVar2 == -1) {
    perror("sysout_loader: can\'t read IFPAGE");
    exit(-1);
  }
  word_swap_page(errmsg + 0xf8,0x2c);
  close(__fd);
  if (verbose == 0) {
    printf("%d",(ulong)ifpage.faultfxp);
  }
  else {
    printf("ifpage.minbversion %d\n",(ulong)ifpage.faultfxp);
    printf("ifpage.process_size %d\n",(ulong)(uint)ifpage.nactivepages);
    printf("ifpage.storagefullstate %d\n",(ulong)ifpage.mdszonelength);
    printf("ifpage.nactivepages %d\n",(ulong)ifpage.dlnilp3);
  }
  return;
}

Assistant:

void check_sysout(char *sysout_file_name, int verbose) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif
  close(sysout);
  if (verbose) {
      printf("ifpage.minbversion %d\n", ifpage.minbversion);
      printf("ifpage.process_size %d\n", ifpage.process_size);
      printf("ifpage.storagefullstate %d\n", ifpage.storagefullstate);
      printf("ifpage.nactivepages %d\n", ifpage.nactivepages);
  } else {
      printf("%d", ifpage.minbversion);
  }
}